

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve_avx2.h
# Opt level: O2

void xy_x_round_store_32_avx2(__m256i *res,int16_t *dst)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  
  auVar1._8_2_ = 2;
  auVar1._0_8_ = 0x2000200020002;
  auVar1._10_2_ = 2;
  auVar1._12_2_ = 2;
  auVar1._14_2_ = 2;
  auVar1._16_2_ = 2;
  auVar1._18_2_ = 2;
  auVar1._20_2_ = 2;
  auVar1._22_2_ = 2;
  auVar1._24_2_ = 2;
  auVar1._26_2_ = 2;
  auVar1._28_2_ = 2;
  auVar1._30_2_ = 2;
  auVar2 = vpaddw_avx2(auVar1,(undefined1  [32])*res);
  auVar1 = vpaddw_avx2(auVar1,(undefined1  [32])res[1]);
  auVar3._0_16_ = ZEXT116(0) * auVar1._0_16_ + ZEXT116(1) * auVar2._0_16_;
  auVar3._16_16_ = ZEXT116(0) * auVar2._16_16_ + ZEXT116(1) * auVar1._0_16_;
  auVar3 = vpsraw_avx2(auVar3,2);
  auVar2 = vperm2i128_avx2(auVar2,auVar1,0x31);
  auVar2 = vpsraw_avx2(auVar2,2);
  *(undefined1 (*) [32])dst = auVar3;
  *(undefined1 (*) [32])(dst + 0x10) = auVar2;
  return;
}

Assistant:

static inline void xy_x_round_store_32_avx2(const __m256i res[2],
                                            int16_t *const dst) {
  __m256i r[2];

  r[0] = xy_x_round_avx2(res[0]);
  r[1] = xy_x_round_avx2(res[1]);
  const __m256i d0 =
      _mm256_inserti128_si256(r[0], _mm256_castsi256_si128(r[1]), 1);
  const __m256i d1 =
      _mm256_inserti128_si256(r[1], _mm256_extracti128_si256(r[0], 1), 0);
  _mm256_storeu_si256((__m256i *)dst, d0);
  _mm256_storeu_si256((__m256i *)(dst + 16), d1);
}